

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_transaction.cpp
# Opt level: O3

ClientContext * __thiscall duckdb::CatalogTransaction::GetContext(CatalogTransaction *this)

{
  InternalException *this_00;
  string local_40;
  
  if ((this->context).ptr != (ClientContext *)0x0) {
    optional_ptr<duckdb::ClientContext,_true>::CheckValid(&this->context);
    return (this->context).ptr;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,
             "Attempting to get a context in a CatalogTransaction without a context","");
  InternalException::InternalException(this_00,&local_40);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

CatalogTransaction CatalogTransaction::GetSystemTransaction(DatabaseInstance &db) {
	return CatalogTransaction(db, 1, 1);
}